

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldIteratorTest_ComparableConstConversion_Test::
~RepeatedPtrFieldIteratorTest_ComparableConstConversion_Test
          (RepeatedPtrFieldIteratorTest_ComparableConstConversion_Test *this)

{
  RepeatedPtrFieldIteratorTest_ComparableConstConversion_Test *this_local;
  
  ~RepeatedPtrFieldIteratorTest_ComparableConstConversion_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F(RepeatedPtrFieldIteratorTest, ComparableConstConversion) {
  RepeatedPtrField<std::string>::iterator iter = proto_array_.begin();
  RepeatedPtrField<std::string>::const_iterator iter2 = iter + 1;
  EXPECT_TRUE(iter == iter);
  EXPECT_TRUE(iter == proto_array_.cbegin());
  EXPECT_TRUE(proto_array_.cbegin() == iter);
  EXPECT_TRUE(iter != iter2);
  EXPECT_TRUE(iter2 != iter);
  EXPECT_TRUE(iter < iter2);
  EXPECT_TRUE(iter <= iter2);
  EXPECT_TRUE(iter <= iter);
  EXPECT_TRUE(iter2 > iter);
  EXPECT_TRUE(iter2 >= iter);
  EXPECT_TRUE(iter >= iter);
}